

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O3

Host * __thiscall Vault::Client::getHost_abi_cxx11_(Host *__return_storage_ptr__,Client *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->value_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->value_).field_2;
  pcVar1 = (this->host_).value_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->host_).value_._M_string_length)
  ;
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] virtual Host getHost() const { return host_; }